

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O1

int __thiscall QLCDNumberPrivate::init(QLCDNumberPrivate *this,EVP_PKEY_CTX *ctx)

{
  byte *pbVar1;
  QWidget *this_00;
  int extraout_EAX;
  
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  QFrame::setFrameStyle((QFrame *)this_00,0x21);
  this->val = 0.0;
  this->field_0x288 = (this->field_0x288 & 0xf8) + 1;
  QLCDNumber::setDigitCount((QLCDNumber *)this_00,this->ndigits);
  pbVar1 = (byte *)(*(long *)&this_00->field_0x8 + 0x288);
  *pbVar1 = *pbVar1 | 0x18;
  QWidget::update(this_00);
  QWidget::setSizePolicy(this_00,(QSizePolicy)0x110000);
  return extraout_EAX;
}

Assistant:

void QLCDNumberPrivate::init()
{
    Q_Q(QLCDNumber);

    q->setFrameStyle(QFrame::Box | QFrame::Raised);
    val        = 0;
    base       = QLCDNumber::Dec;
    smallPoint = false;
    q->setDigitCount(ndigits);
    q->setSegmentStyle(QLCDNumber::Filled);
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Minimum));
}